

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void TM16_SSE2(uint8_t *dst)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  long lVar15;
  short sVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar17 [16];
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  
  auVar2 = *(undefined1 (*) [16])(dst + -0x20);
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar2._0_13_;
  auVar3[0xe] = auVar2[7];
  auVar4[0xc] = auVar2[6];
  auVar4._0_12_ = auVar2._0_12_;
  auVar4._13_2_ = auVar3._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = auVar2._0_11_;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6[10] = auVar2[5];
  auVar6._0_10_ = auVar2._0_10_;
  auVar6._11_4_ = auVar5._11_4_;
  auVar7[9] = 0;
  auVar7._0_9_ = auVar2._0_9_;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = auVar2[4];
  auVar8._0_8_ = auVar2._0_8_;
  auVar8._9_6_ = auVar7._9_6_;
  auVar9._7_8_ = 0;
  auVar9._0_7_ = auVar8._8_7_;
  Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),auVar2[3]);
  auVar13._9_6_ = 0;
  auVar13._0_9_ = Var10;
  auVar11._1_10_ = SUB1510(auVar13 << 0x30,5);
  auVar11[0] = auVar2[2];
  auVar14._11_4_ = 0;
  auVar14._0_11_ = auVar11;
  auVar12._1_12_ = SUB1512(auVar14 << 0x20,3);
  auVar12[0] = auVar2[1];
  lVar15 = 0;
  do {
    auVar17 = pshuflw(ZEXT416((uint)dst[lVar15 + -1] - (uint)dst[-0x21]),
                      ZEXT416((uint)dst[lVar15 + -1] - (uint)dst[-0x21]),0);
    sVar23 = auVar17._0_2_;
    sVar25 = sVar23 + (ushort)auVar2[0];
    sVar24 = auVar17._2_2_;
    sVar26 = sVar24 + auVar12._0_2_;
    sVar27 = sVar23 + auVar11._0_2_;
    sVar28 = sVar24 + (short)Var10;
    sVar29 = sVar23 + auVar8._8_2_;
    sVar30 = sVar24 + auVar6._10_2_;
    sVar31 = sVar23 + auVar4._12_2_;
    sVar32 = sVar24 + (auVar3._13_2_ >> 8);
    sVar16 = sVar23 + (ushort)auVar2[8];
    sVar18 = sVar24 + (ushort)auVar2[9];
    sVar19 = sVar23 + (ushort)auVar2[10];
    sVar20 = sVar24 + (ushort)auVar2[0xb];
    sVar21 = sVar23 + (ushort)auVar2[0xc];
    sVar22 = sVar24 + (ushort)auVar2[0xd];
    sVar23 = sVar23 + (ushort)auVar2[0xe];
    sVar24 = sVar24 + (ushort)auVar2[0xf];
    puVar1 = dst + lVar15;
    *puVar1 = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
    puVar1[1] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
    puVar1[2] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
    puVar1[3] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
    puVar1[4] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
    puVar1[5] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
    puVar1[6] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
    puVar1[7] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
    puVar1[8] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    puVar1[9] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    puVar1[10] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    puVar1[0xb] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    puVar1[0xc] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    puVar1[0xd] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    puVar1[0xe] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    puVar1[0xf] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
    lVar15 = lVar15 + 0x20;
  } while ((int)lVar15 != 0x200);
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion_SSE2(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const __m128i zero = _mm_setzero_si128();
  int y;
  if (size == 4) {
    const __m128i top_values = _mm_cvtsi32_si128(WebPMemToUint32(top));
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 4; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      WebPUint32ToMem(dst, _mm_cvtsi128_si32(out));
    }
  } else if (size == 8) {
    const __m128i top_values = _mm_loadl_epi64((const __m128i*)top);
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 8; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      _mm_storel_epi64((__m128i*)dst, out);
    }
  } else {
    const __m128i top_values = _mm_loadu_si128((const __m128i*)top);
    const __m128i top_base_0 = _mm_unpacklo_epi8(top_values, zero);
    const __m128i top_base_1 = _mm_unpackhi_epi8(top_values, zero);
    for (y = 0; y < 16; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out_0 = _mm_add_epi16(base, top_base_0);
      const __m128i out_1 = _mm_add_epi16(base, top_base_1);
      const __m128i out = _mm_packus_epi16(out_0, out_1);
      _mm_storeu_si128((__m128i*)dst, out);
    }
  }
}